

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O2

void __thiscall
CaDiCaL::Internal::connect_proof_tracer
          (Internal *this,FileTracer *tracer,bool antecedents,bool finalize_clauses)

{
  undefined3 in_register_00000009;
  socklen_t __len;
  undefined3 in_register_00000011;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  FileTracer *local_28;
  
  __len = CONCAT31(in_register_00000009,finalize_clauses);
  local_28 = tracer;
  new_proof_on_demand(this);
  if (((CONCAT31(in_register_00000011,antecedents) != 0) && (this->lrat == false)) &&
     (this->lratbuilder == (LratBuilder *)0x0)) {
    this->lrat = true;
  }
  if (finalize_clauses) {
    this->frat = true;
  }
  resize_unit_clauses_idx(this);
  (*(tracer->super_InternalTracer).super_Tracer._vptr_Tracer[0x12])(tracer,this);
  Proof::connect(this->proof,(int)tracer,(sockaddr *)CONCAT44(extraout_var,extraout_EDX),__len);
  std::vector<CaDiCaL::FileTracer_*,_std::allocator<CaDiCaL::FileTracer_*>_>::push_back
            (&this->file_tracers,&local_28);
  return;
}

Assistant:

void Internal::connect_proof_tracer (FileTracer *tracer, bool antecedents,
                                     bool finalize_clauses) {
  new_proof_on_demand ();
  if (antecedents)
    force_lrat ();
  if (finalize_clauses)
    frat = true;
  resize_unit_clauses_idx ();
  tracer->connect_internal (this);
  proof->connect (tracer);
  file_tracers.push_back (tracer);
}